

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int generate_by_miniscript_or_b
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  uchar append;
  size_t indexes [2];
  uchar local_19;
  size_t local_18 [3];
  
  local_19 = 0x9b;
  local_18[0] = 0;
  local_18[1] = 1;
  iVar1 = generate_by_miniscript_concat
                    (node,parent,derive_child_num,2,local_18,(uchar *)0x0,0,(uchar *)0x0,0,
                     (uchar *)0x0,0,&local_19,1,script,script_len,write_len);
  return iVar1;
}

Assistant:

static int generate_by_miniscript_or_b(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    unsigned char append = OP_BOOLOR;
    const size_t indexes[] = {0, 1};
    /* [X] [Y] OP_BOOLOR */
    return generate_by_miniscript_concat(
        node,
        parent,
        derive_child_num,
        2,
        indexes,
        NULL,
        0,
        NULL,
        0,
        NULL,
        0,
        &append,
        1,
        script,
        script_len,
        write_len);
}